

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_mkdir(int nargs,char **args)

{
  int iVar1;
  uint __owner;
  ulong uVar2;
  int *piVar3;
  long in_RSI;
  int in_EDI;
  gid_t gid;
  uid_t uid;
  mode_t mode;
  char *in_stack_ffffffffffffffd8;
  __gid_t local_1c;
  __mode_t local_14;
  int local_4;
  
  local_14 = 0x1ed;
  if (2 < in_EDI) {
    uVar2 = strtoul(*(char **)(in_RSI + 0x10),(char **)0x0,8);
    local_14 = (__mode_t)uVar2;
  }
  iVar1 = mkdir(*(char **)(in_RSI + 8),local_14);
  if (iVar1 == 0) {
    if (3 < in_EDI) {
      __owner = decode_uid(in_stack_ffffffffffffffd8);
      local_1c = 0xffffffff;
      if (in_EDI == 5) {
        local_1c = decode_uid(in_stack_ffffffffffffffd8);
      }
      iVar1 = chown(*(char **)(in_RSI + 8),__owner,local_1c);
      if (iVar1 != 0) {
        piVar3 = __errno_location();
        return -*piVar3;
      }
    }
    local_4 = 0;
  }
  else {
    piVar3 = __errno_location();
    local_4 = -*piVar3;
  }
  return local_4;
}

Assistant:

int do_mkdir(int nargs, char **args)
{
    mode_t mode = 0755;

    /* mkdir <path> [mode] [owner] [group] */

    if (nargs >= 3) {
        mode = strtoul(args[2], 0, 8);
    }

    if (mkdir(args[1], mode)) {
        return -errno;
    }

    if (nargs >= 4) {
        uid_t uid = decode_uid(args[3]);
        gid_t gid = -1;

        if (nargs == 5) {
            gid = decode_uid(args[4]);
        }

        if (chown(args[1], uid, gid)) {
            return -errno;
        }
    }

    return 0;
}